

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::GetAccessors
               (RecyclableObject *instance,PropertyId propertyId,ScriptContext *requestContext,
               Var *getter,Var *setter)

{
  int iVar1;
  BOOL BVar2;
  Var pvVar3;
  
  while( true ) {
    if (((instance->type).ptr)->typeId == TypeIds_Null) {
      return 0;
    }
    iVar1 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x15])
                      (instance,(ulong)(uint)propertyId,getter,setter,requestContext);
    if (iVar1 != 0) break;
    BVar2 = RecyclableObject::SkipsPrototype(instance);
    if (BVar2 != 0) {
      return 0;
    }
    instance = GetPrototype(instance);
  }
  pvVar3 = CanonicalizeAccessor(*getter,requestContext);
  *getter = pvVar3;
  pvVar3 = CanonicalizeAccessor(*setter,requestContext);
  *setter = pvVar3;
  return 1;
}

Assistant:

JavascriptOperators::GetAccessors(RecyclableObject* instance, PropertyId propertyId, ScriptContext* requestContext, _Out_ Var* getter, _Out_ Var* setter)
    {
        RecyclableObject* object = instance;
        while (!JavascriptOperators::IsNull(object))
        {
            if (object->GetAccessors(propertyId, getter, setter, requestContext))
            {
                *getter = JavascriptOperators::CanonicalizeAccessor(*getter, requestContext);
                *setter = JavascriptOperators::CanonicalizeAccessor(*setter, requestContext);
                return TRUE;
            }

            if (object->SkipsPrototype())
            {
                break;
            }
            object = JavascriptOperators::GetPrototype(object);
        }
        return FALSE;
    }